

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O0

void WriteCounts(Stream *stream,OpcodeInfoCounts *info_counts)

{
  pointer ppVar1;
  unsigned_long uVar2;
  size_t this;
  bool bVar3;
  mapped_type *pmVar4;
  iterator iVar5;
  iterator iVar6;
  back_insert_iterator<std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
  bVar7;
  iterator iVar8;
  iterator iVar9;
  char *pcVar10;
  size_t count_1;
  reference ppStack_f0;
  Opcode opcode_1;
  pair<wabt::Opcode,_unsigned_long> *pair;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  *__range1_1;
  undefined1 local_90 [8];
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  sorted;
  size_t count;
  reference ppStack_68;
  Opcode opcode;
  pair<const_wabt::OpcodeInfo,_unsigned_long> *info_count_pair;
  const_iterator __end1;
  const_iterator __begin1;
  OpcodeInfoCounts *__range1;
  map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  counts;
  OpcodeInfoCounts *info_counts_local;
  Stream *stream_local;
  
  counts._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)info_counts;
  std::
  map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  ::map((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
         *)&__range1);
  this = counts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end1 = std::
           map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
           ::begin((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
                    *)counts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  info_count_pair =
       (pair<const_wabt::OpcodeInfo,_unsigned_long> *)
       std::
       map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
       ::end((map<wabt::OpcodeInfo,_unsigned_long,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
              *)this);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&info_count_pair);
    if (!bVar3) break;
    ppStack_68 = std::_Rb_tree_const_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>::
                 operator*(&__end1);
    count._4_4_ = wabt::OpcodeInfo::opcode(&ppStack_68->first);
    ppVar1 = (pointer)ppStack_68->second;
    sorted.
    super__Vector_base<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
    pmVar4 = std::
             map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
             ::operator[]((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
                           *)&__range1,(key_type *)((long)&count + 4));
    *pmVar4 = (long)&(ppVar1->first).enum_ + *pmVar4;
    std::_Rb_tree_const_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>::operator++
              (&__end1);
  }
  std::
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  ::vector((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
            *)local_90);
  iVar5 = std::
          map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
          ::begin((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
                   *)&__range1);
  iVar6 = std::
          map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
          ::end((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
                 *)&__range1);
  bVar7 = std::
          back_inserter<std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>
                    ((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
                      *)local_90);
  std::
  copy_if<std::_Rb_tree_iterator<std::pair<wabt::Opcode_const,unsigned_long>>,std::back_insert_iterator<std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,WithinCutoff<std::pair<wabt::Opcode,unsigned_long>>>
            (iVar5._M_node,iVar6._M_node,bVar7.container);
  iVar8 = std::
          vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
          ::begin((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
                   *)local_90);
  iVar9 = std::
          vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
          ::end((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
                 *)local_90);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<wabt::Opcode,unsigned_long>*,std::vector<std::pair<wabt::Opcode,unsigned_long>,std::allocator<std::pair<wabt::Opcode,unsigned_long>>>>,SortByCountDescending<std::pair<wabt::Opcode,unsigned_long>>>
            (iVar8._M_current,iVar9._M_current);
  __end1_1 = std::
             vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
             ::begin((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
                      *)local_90);
  pair = (pair<wabt::Opcode,_unsigned_long> *)
         std::
         vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
         ::end((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
                *)local_90);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
                        *)&pair);
    if (!bVar3) break;
    ppStack_f0 = __gnu_cxx::
                 __normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
                 ::operator*(&__end1_1);
    count_1._4_4_ = (ppStack_f0->first).enum_;
    uVar2 = ppStack_f0->second;
    pcVar10 = wabt::Opcode::GetName((Opcode *)((long)&count_1 + 4));
    wabt::Stream::Writef(stream,"%s%s%zd\n",pcVar10,s_separator,uVar2);
    __gnu_cxx::
    __normal_iterator<std::pair<wabt::Opcode,_unsigned_long>_*,_std::vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
  ::~vector((vector<std::pair<wabt::Opcode,_unsigned_long>,_std::allocator<std::pair<wabt::Opcode,_unsigned_long>_>_>
             *)local_90);
  std::
  map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
  ::~map((map<wabt::Opcode,_unsigned_long,_std::less<wabt::Opcode>,_std::allocator<std::pair<const_wabt::Opcode,_unsigned_long>_>_>
          *)&__range1);
  return;
}

Assistant:

void WriteCounts(Stream& stream, const OpcodeInfoCounts& info_counts) {
  typedef std::pair<Opcode, size_t> OpcodeCountPair;

  std::map<Opcode, size_t> counts;
  for (auto& info_count_pair: info_counts) {
    Opcode opcode = info_count_pair.first.opcode();
    size_t count = info_count_pair.second;
    counts[opcode] += count;
  }

  std::vector<OpcodeCountPair> sorted;
  std::copy_if(counts.begin(), counts.end(), std::back_inserter(sorted),
               WithinCutoff<OpcodeCountPair>());

  // Use a stable sort to keep the elements with the same count in opcode
  // order (since the Opcode map is sorted).
  std::stable_sort(sorted.begin(), sorted.end(),
                   SortByCountDescending<OpcodeCountPair>());

  for (auto& pair : sorted) {
    Opcode opcode = pair.first;
    size_t count = pair.second;
    stream.Writef("%s%s%" PRIzd "\n", opcode.GetName(), s_separator, count);
  }
}